

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O0

lzma_ret lzma_block_header_encode(lzma_block *block,uint8_t *out)

{
  lzma_ret lVar1;
  uint32_t num;
  lzma_vli lVar2;
  uint8_t *buf;
  long lStack_40;
  lzma_ret ret__2;
  size_t filter_count;
  lzma_ret ret__1;
  lzma_ret ret_;
  size_t out_pos;
  size_t out_size;
  uint8_t *out_local;
  lzma_block *block_local;
  
  out_size = (size_t)out;
  out_local = (uint8_t *)block;
  lVar2 = lzma_block_unpadded_size(block);
  if ((lVar2 == 0) ||
     ((0x7fffffffffffffff < *(ulong *)(out_local + 0x18) && (*(long *)(out_local + 0x18) != -1)))) {
    block_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    out_pos = (size_t)(*(int *)(out_local + 4) - 4U);
    *(char *)out_size = (char)(*(int *)(out_local + 4) - 4U >> 2);
    *(undefined1 *)(out_size + 1) = 0;
    _ret__1 = 2;
    if (*(long *)(out_local + 0x10) != -1) {
      lVar1 = lzma_vli_encode(*(lzma_vli *)(out_local + 0x10),(size_t *)0x0,(uint8_t *)out_size,
                              (size_t *)&ret__1,out_pos);
      if (lVar1 != LZMA_OK) {
        return lVar1;
      }
      *(byte *)(out_size + 1) = *(byte *)(out_size + 1) | 0x40;
    }
    if (*(long *)(out_local + 0x18) != -1) {
      lVar1 = lzma_vli_encode(*(lzma_vli *)(out_local + 0x18),(size_t *)0x0,(uint8_t *)out_size,
                              (size_t *)&ret__1,out_pos);
      if (lVar1 != LZMA_OK) {
        return lVar1;
      }
      *(byte *)(out_size + 1) = *(byte *)(out_size + 1) | 0x80;
    }
    if ((*(long *)(out_local + 0x20) == 0) || (**(long **)(out_local + 0x20) == -1)) {
      block_local._4_4_ = LZMA_PROG_ERROR;
    }
    else {
      lStack_40 = 0;
      do {
        if (lStack_40 == 4) {
          return LZMA_PROG_ERROR;
        }
        lVar1 = lzma_filter_flags_encode
                          ((lzma_filter *)(*(long *)(out_local + 0x20) + lStack_40 * 0x10),
                           (uint8_t *)out_size,(size_t *)&ret__1,out_pos);
        if (lVar1 != LZMA_OK) {
          return lVar1;
        }
        lStack_40 = lStack_40 + 1;
      } while (*(long *)(*(long *)(out_local + 0x20) + lStack_40 * 0x10) != -1);
      *(byte *)(out_size + 1) = *(byte *)(out_size + 1) | (char)lStack_40 - 1U;
      memset((void *)(out_size + _ret__1),0,out_pos - _ret__1);
      buf = (uint8_t *)(out_size + out_pos);
      num = lzma_crc32((uint8_t *)out_size,out_pos,0);
      write32ne(buf,num);
      block_local._4_4_ = LZMA_OK;
    }
  }
  return block_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_encode(const lzma_block *block, uint8_t *out)
{
	// Validate everything but filters.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Indicate the size of the buffer _excluding_ the CRC32 field.
	const size_t out_size = block->header_size - 4;

	// Store the Block Header Size.
	out[0] = out_size / 4;

	// We write Block Flags in pieces.
	out[1] = 0x00;
	size_t out_pos = 2;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->compressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x40;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->uncompressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x80;
	}

	// Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	size_t filter_count = 0;
	do {
		// There can be a maximum of four filters.
		if (filter_count == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		return_if_error(lzma_filter_flags_encode(
				block->filters + filter_count,
				out, &out_pos, out_size));

	} while (block->filters[++filter_count].id != LZMA_VLI_UNKNOWN);

	out[1] |= filter_count - 1;

	// Padding
	memzero(out + out_pos, out_size - out_pos);

	// CRC32
	unaligned_write32le(out + out_size, lzma_crc32(out, out_size, 0));

	return LZMA_OK;
}